

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamRandomAccessController_p.cpp
# Opt level: O2

bool __thiscall
BamTools::Internal::BamRandomAccessController::OpenIndex
          (BamRandomAccessController *this,string *indexFilename,BamReaderPrivate *reader)

{
  int iVar1;
  BamIndex *index;
  string message_1;
  string message;
  allocator local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  index = BamIndexFactory::CreateIndexFromFilename(indexFilename,reader);
  if (index == (BamIndex *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_b8,"could not open index file: ",(allocator *)&local_98);
    std::operator+(&local_78,&local_b8,indexFilename);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string
              ((string *)&local_b8,"BamRandomAccessController::OpenIndex",(allocator *)&local_98);
    SetErrorString(this,&local_b8,&local_78);
  }
  else {
    iVar1 = (*index->_vptr_BamIndex[5])(index,indexFilename);
    if ((char)iVar1 != '\0') {
      SetIndex(this,index);
      return true;
    }
    std::__cxx11::string::string((string *)&local_78,(string *)&index->m_errorString);
    std::__cxx11::string::string
              ((string *)&local_38,"could not load index data from file: ",&local_b9);
    std::operator+(&local_58,&local_38,indexFilename);
    std::operator+(&local_98,&local_58,"\n\t");
    std::operator+(&local_b8,&local_98,&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::string
              ((string *)&local_98,"BamRandomAccessController::OpenIndex",(allocator *)&local_58);
    SetErrorString(this,&local_98,&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
  }
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_78);
  return false;
}

Assistant:

bool BamRandomAccessController::OpenIndex(const string& indexFilename, BamReaderPrivate* reader) {

    // attempt create new index of type based on filename
    BamIndex* index = BamIndexFactory::CreateIndexFromFilename(indexFilename, reader);
    if ( index == 0 ) {
        const string message = string("could not open index file: ") + indexFilename;
        SetErrorString("BamRandomAccessController::OpenIndex", message);
        return false;
    }

    // attempt to load data from index file
    if ( !index->Load(indexFilename) ) {
        const string indexError = index->GetErrorString();
        const string message = string("could not load index data from file: ") + indexFilename +
                               "\n\t" + indexError;
        SetErrorString("BamRandomAccessController::OpenIndex", message);
        return false;
    }

    // save new index & return success
    SetIndex(index);
    return true;
}